

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcItemRectClosestPoint(ImVec2 *pos,bool on_edge,float outward)

{
  ImVec2 IVar1;
  undefined1 auStack_38 [8];
  ImRect rect;
  ImGuiWindow *window;
  float outward_local;
  bool on_edge_local;
  ImVec2 *pos_local;
  
  rect.Max = (ImVec2)GetCurrentWindowRead();
  auStack_38 = *(undefined1 (*) [8])((long)rect.Max + 0xfc);
  rect.Min = *(ImVec2 *)((long)rect.Max + 0x104);
  ImRect::Expand((ImRect *)auStack_38,outward);
  IVar1 = ImRect::GetClosestPoint((ImRect *)auStack_38,*pos,on_edge);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcItemRectClosestPoint(const ImVec2& pos, bool on_edge, float outward)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImRect rect = window->DC.LastItemRect;
    rect.Expand(outward);
    return rect.GetClosestPoint(pos, on_edge);
}